

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_pcons.cc
# Opt level: O0

void * v2i_POLICY_CONSTRAINTS(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *values)

{
  long lVar1;
  int iVar2;
  CONF_VALUE *pCVar3;
  CONF_VALUE *val;
  size_t i;
  POLICY_CONSTRAINTS *pcons;
  stack_st_CONF_VALUE *values_local;
  X509V3_CTX *ctx_local;
  X509V3_EXT_METHOD *method_local;
  
  method_local = (X509V3_EXT_METHOD *)POLICY_CONSTRAINTS_new();
  if (method_local == (X509V3_EXT_METHOD *)0x0) {
    method_local = (X509V3_EXT_METHOD *)0x0;
  }
  else {
    for (val = (CONF_VALUE *)0x0; pCVar3 = (CONF_VALUE *)sk_CONF_VALUE_num(values), val < pCVar3;
        val = (CONF_VALUE *)((long)&val->section + 1)) {
      pCVar3 = sk_CONF_VALUE_value(values,(size_t)val);
      iVar2 = strcmp(pCVar3->name,"requireExplicitPolicy");
      if (iVar2 == 0) {
        iVar2 = X509V3_get_value_int((CONF_VALUE *)pCVar3,(ASN1_INTEGER **)method_local);
      }
      else {
        iVar2 = strcmp(pCVar3->name,"inhibitPolicyMapping");
        if (iVar2 != 0) {
          ERR_put_error(0x14,0,0x7b,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_pcons.cc"
                        ,0x57);
          ERR_add_error_data(6,"section:",pCVar3->section,",name:",pCVar3->name,",value:",
                             pCVar3->value);
          goto LAB_0031a2cd;
        }
        iVar2 = X509V3_get_value_int((CONF_VALUE *)pCVar3,(ASN1_INTEGER **)&method_local->it);
      }
      if (iVar2 == 0) goto LAB_0031a2cd;
    }
    if ((method_local->it == (ASN1_ITEM_EXP *)0x0) &&
       (lVar1._0_4_ = method_local->ext_nid, lVar1._4_4_ = method_local->ext_flags, lVar1 == 0)) {
      ERR_put_error(0x14,0,0x75,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_pcons.cc"
                    ,0x5d);
LAB_0031a2cd:
      POLICY_CONSTRAINTS_free((POLICY_CONSTRAINTS *)method_local);
      method_local = (X509V3_EXT_METHOD *)0x0;
    }
  }
  return method_local;
}

Assistant:

static void *v2i_POLICY_CONSTRAINTS(const X509V3_EXT_METHOD *method,
                                    const X509V3_CTX *ctx,
                                    const STACK_OF(CONF_VALUE) *values) {
  POLICY_CONSTRAINTS *pcons = NULL;
  if (!(pcons = POLICY_CONSTRAINTS_new())) {
    return NULL;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(values); i++) {
    const CONF_VALUE *val = sk_CONF_VALUE_value(values, i);
    if (!strcmp(val->name, "requireExplicitPolicy")) {
      if (!X509V3_get_value_int(val, &pcons->requireExplicitPolicy)) {
        goto err;
      }
    } else if (!strcmp(val->name, "inhibitPolicyMapping")) {
      if (!X509V3_get_value_int(val, &pcons->inhibitPolicyMapping)) {
        goto err;
      }
    } else {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_NAME);
      X509V3_conf_err(val);
      goto err;
    }
  }
  if (!pcons->inhibitPolicyMapping && !pcons->requireExplicitPolicy) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_ILLEGAL_EMPTY_EXTENSION);
    goto err;
  }

  return pcons;
err:
  POLICY_CONSTRAINTS_free(pcons);
  return NULL;
}